

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O0

char * __thiscall kj::StringTree::flattenTo(StringTree *this,char *target)

{
  anon_class_8_1_6ca262cf local_20;
  char *local_18;
  char *target_local;
  StringTree *this_local;
  
  local_20.target = &local_18;
  local_18 = target;
  target_local = (char *)this;
  visit<kj::StringTree::flattenTo(char*)const::__0>(this,&local_20);
  return local_18;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target) const {
  visit([&target](ArrayPtr<const char> text) {
    memcpy(target, text.begin(), text.size());
    target += text.size();
  });
  return target;
}